

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O1

void llvm::format_provider<unsigned_int,_void>::format(uint *V,raw_ostream *Stream,StringRef Style)

{
  bool bVar1;
  HexPrintStyle HVar2;
  size_t MinDigits;
  undefined8 in_R9;
  HexPrintStyle HVar3;
  IntegerStyle Style_00;
  StringRef Prefix;
  StringRef Prefix_00;
  StringRef Prefix_01;
  StringRef Prefix_02;
  Optional<unsigned_long> Width;
  undefined1 local_48 [8];
  StringRef Style_local;
  unsigned_long_long ULLVal;
  HexPrintStyle HS;
  
  Style_local.Data = (char *)Style.Length;
  local_48 = (undefined1  [8])Style.Data;
  bVar1 = detail::HelperFunctions::consumeHexStyle
                    ((StringRef *)local_48,(HexPrintStyle *)((long)&ULLVal + 4));
  HVar2 = ULLVal._4_4_;
  if (bVar1) {
    bVar1 = consumeUnsignedInteger((StringRef *)local_48,10,&Style_local.Length);
    if (bVar1) {
      HVar3 = Upper;
    }
    else {
      HVar3 = (HexPrintStyle)Style_local.Length;
    }
    bVar1 = isPrefixedHexStyle(HVar2);
    HVar2 = HVar3 + PrefixUpper;
    if (!bVar1) {
      HVar2 = HVar3;
    }
    Width.Storage._8_8_ = in_R9;
    Width.Storage.field_0.value = 1;
    write_hex((llvm *)Stream,(raw_ostream *)(ulong)*V,(ulong)ULLVal._4_4_,HVar2,Width);
  }
  else {
    Prefix.Length = 1;
    Prefix.Data = "N";
    bVar1 = StringRef::consume_front((StringRef *)local_48,Prefix);
    Style_00 = Number;
    if (!bVar1) {
      Prefix_00.Length = 1;
      Prefix_00.Data = "n";
      bVar1 = StringRef::consume_front((StringRef *)local_48,Prefix_00);
      if (!bVar1) {
        Prefix_01.Length = 1;
        Prefix_01.Data = "D";
        bVar1 = StringRef::consume_front((StringRef *)local_48,Prefix_01);
        Style_00 = Integer;
        if (!bVar1) {
          Prefix_02.Length = 1;
          Prefix_02.Data = "d";
          StringRef::consume_front((StringRef *)local_48,Prefix_02);
          Style_00 = Integer;
        }
      }
    }
    bVar1 = consumeUnsignedInteger((StringRef *)local_48,10,&Style_local.Length);
    if (Style_local.Data != (char *)0x0) {
      __assert_fail("Style.empty() && \"Invalid integral format style!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                    ,0x93,
                    "static void llvm::format_provider<unsigned int>::format(const T &, llvm::raw_ostream &, StringRef) [T = unsigned int, Enable = void]"
                   );
    }
    MinDigits = 0;
    if (!bVar1) {
      MinDigits = Style_local.Length;
    }
    write_integer(Stream,*V,MinDigits,Style_00);
  }
  return;
}

Assistant:

static void format(const T &V, llvm::raw_ostream &Stream, StringRef Style) {
    HexPrintStyle HS;
    size_t Digits = 0;
    if (consumeHexStyle(Style, HS)) {
      Digits = consumeNumHexDigits(Style, HS, 0);
      write_hex(Stream, V, HS, Digits);
      return;
    }

    IntegerStyle IS = IntegerStyle::Integer;
    if (Style.consume_front("N") || Style.consume_front("n"))
      IS = IntegerStyle::Number;
    else if (Style.consume_front("D") || Style.consume_front("d"))
      IS = IntegerStyle::Integer;

    Style.consumeInteger(10, Digits);
    assert(Style.empty() && "Invalid integral format style!");
    write_integer(Stream, V, Digits, IS);
  }